

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O0

void __thiscall random_tests::fastrandom_randbits::test_method(fastrandom_randbits *this)

{
  long lVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  uint64_t rand;
  uint64_t range;
  uint64_t rangebits;
  int j;
  int bits;
  FastRandomContext ctx2;
  FastRandomContext ctx1;
  char *in_stack_fffffffffffffd88;
  lazy_ostream *in_stack_fffffffffffffd90;
  FastRandomContext *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  lazy_ostream *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  lazy_ostream *in_stack_fffffffffffffdc8;
  int local_200;
  int local_1fc;
  const_string local_1f0 [2];
  lazy_ostream local_1d0 [2];
  assertion_result local_1b0 [2];
  undefined4 local_174;
  ulong local_170;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffd98,SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffd98,SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
  for (local_1fc = 0; local_1fc < 0x3f; local_1fc = local_1fc + 1) {
    for (local_200 = 0; local_200 < 1000; local_200 = local_200 + 1) {
      uVar2 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                         in_stack_fffffffffffffda4);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
                   (pointer)in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd88);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffdc8,
                   (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8,(const_string *)in_stack_fffffffffffffdb0);
        in_stack_fffffffffffffdc8 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffd90,(char (*) [1])in_stack_fffffffffffffd88);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
                   (pointer)in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
        local_170 = uVar2 >> ((byte)local_1fc & 0x3f);
        local_174 = 0;
        in_stack_fffffffffffffd98 = (FastRandomContext *)0x1c66917;
        in_stack_fffffffffffffd90 = (lazy_ostream *)&local_174;
        in_stack_fffffffffffffd88 = "rangebits >> bits";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (&stack0xfffffffffffffea8,&stack0xfffffffffffffe98,0x7a,1,2,&local_170);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffdc7 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffdc7);
      RandomMixin<FastRandomContext>::randrange<unsigned_long>
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffdb0,
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
      do {
        in_stack_fffffffffffffdb8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
                   (pointer)in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd88);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffdc8,
                   (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8,(const_string *)in_stack_fffffffffffffdb0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd98,
                   SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
        in_stack_fffffffffffffdb0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
                   (pointer)in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffd90,(basic_cstring<const_char> *)in_stack_fffffffffffffd88)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
                   (pointer)in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffd88 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_1b0,local_1d0,local_1f0,0x7d,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffffd88);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffdaf = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffdaf);
    }
  }
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffffd88);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffffd88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_randbits)
{
    FastRandomContext ctx1;
    FastRandomContext ctx2;
    for (int bits = 0; bits < 63; ++bits) {
        for (int j = 0; j < 1000; ++j) {
            uint64_t rangebits = ctx1.randbits(bits);
            BOOST_CHECK_EQUAL(rangebits >> bits, 0U);
            uint64_t range = (uint64_t{1}) << bits | rangebits;
            uint64_t rand = ctx2.randrange(range);
            BOOST_CHECK(rand < range);
        }
    }
}